

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample.cpp
# Opt level: O0

void anon_unknown.dwarf_2d98::gcd_1_thread(void)

{
  int iVar1;
  size_t sVar2;
  anon_class_1_0_00000001 local_39;
  undefined1 local_38 [8];
  Monitor perfmon_scope_monitor_1;
  int j;
  int i;
  int result;
  Monitor perfmon_scope_monitor_0;
  
  sVar2 = gcd_1_thread::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)((long)&i + 3));
  perfmon::internal::Monitor::Monitor((Monitor *)&result,sVar2);
  j = 0;
  for (perfmon_scope_monitor_1.start_tick_._4_4_ = 0; perfmon_scope_monitor_1.start_tick_._4_4_ < N;
      perfmon_scope_monitor_1.start_tick_._4_4_ = perfmon_scope_monitor_1.start_tick_._4_4_ + 1) {
    for (perfmon_scope_monitor_1.start_tick_._0_4_ = 0; (int)perfmon_scope_monitor_1.start_tick_ < N
        ; perfmon_scope_monitor_1.start_tick_._0_4_ = (int)perfmon_scope_monitor_1.start_tick_ + 1)
    {
      sVar2 = gcd_1_thread::anon_class_1_0_00000001::operator()(&local_39);
      perfmon::internal::Monitor::Monitor((Monitor *)local_38,sVar2);
      iVar1 = gcd(perfmon_scope_monitor_1.start_tick_._4_4_,(int)perfmon_scope_monitor_1.start_tick_
                 );
      j = iVar1 + j;
      perfmon::internal::Monitor::~Monitor((Monitor *)local_38);
    }
  }
  std::__atomic_base<int>::operator+=
            ((__atomic_base<int> *)&(anonymous_namespace)::global_gcd_1_result,j);
  perfmon::internal::Monitor::~Monitor((Monitor *)&result);
  return;
}

Assistant:

void gcd_1_thread() {
  PERFMON_SCOPE("gcd_1_thread");
  int result = 0;
  for (int i = 0; i < N; ++i) {
    for (int j = 0; j < N; ++j) {
      PERFMON_SCOPE("congestion_point");
      result += gcd(i, j);
    }
  }
  global_gcd_1_result += result;
}